

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O2

REF_STATUS ref_fixture_pri_tet_cap_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  undefined8 uVar10;
  int iVar11;
  REF_INT RVar12;
  int iVar13;
  long lVar14;
  char *pcVar15;
  int iVar16;
  ulong uVar17;
  REF_INT cell;
  REF_INT local [27];
  
  uVar4 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar4 != 0) {
    uVar17 = (ulong)uVar4;
    pcVar15 = "create";
    uVar10 = 0x28a;
    goto LAB_0012fb6a;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node = pRVar1->node;
  iVar6 = ref_mpi->n;
  iVar7 = ref_mpi->id;
  iVar11 = 0;
  iVar5 = (int)(6 / (long)iVar6);
  iVar13 = iVar5 * iVar6;
  if (6 < iVar13) {
    iVar11 = ((((iVar6 + 6) / iVar6) * (iVar13 + -7)) / iVar5 - iVar13) + 7;
  }
  if (iVar7 == iVar11) {
LAB_0012ea14:
    uVar4 = ref_node_add(ref_node,0,local);
    if (uVar4 != 0) {
      uVar17 = (ulong)uVar4;
      pcVar15 = "add node";
      uVar10 = 0x2a0;
      goto LAB_0012fb6a;
    }
    pRVar2 = ref_node->real;
    lVar14 = (long)local[0];
    pRVar2[lVar14 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar14 * 0xf;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    lVar9 = -1;
    if (((-1 < lVar14) && (local[0] < ref_node->max)) && (-1 < ref_node->global[lVar14])) {
      lVar9 = ref_node->global[lVar14];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 6) / iVar6;
    if (lVar9 / (long)iVar7 < (long)(ulong)((int)(6 % (long)iVar6) + 1)) {
      lVar9 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar9 = ref_node->global[lVar14];
        }
      }
      RVar12 = (REF_INT)(lVar9 / (long)iVar7);
    }
    else {
      lVar9 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar9 = ref_node->global[lVar14];
        }
      }
      iVar5 = (int)(6 / (long)iVar6);
      iVar6 = 7 - iVar6 * iVar5;
      RVar12 = iVar6 + (int)((lVar9 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar14] = RVar12;
    uVar4 = ref_node_add(ref_node,1,local + 1);
    if (uVar4 != 0) {
      uVar17 = (ulong)uVar4;
      pcVar15 = "add node";
      uVar10 = 0x2a1;
      goto LAB_0012fb6a;
    }
    pRVar2 = ref_node->real;
    lVar14 = (long)local[1];
    pRVar2[lVar14 * 0xf] = 1.0;
    pRVar2 = pRVar2 + lVar14 * 0xf + 1;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    lVar9 = -1;
    if (((-1 < lVar14) && (local[1] < ref_node->max)) && (-1 < ref_node->global[lVar14])) {
      lVar9 = ref_node->global[lVar14];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 6) / iVar6;
    if (lVar9 / (long)iVar7 < (long)(ulong)((int)(6 % (long)iVar6) + 1)) {
      lVar9 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar9 = ref_node->global[lVar14];
        }
      }
      RVar12 = (REF_INT)(lVar9 / (long)iVar7);
    }
    else {
      lVar9 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar9 = ref_node->global[lVar14];
        }
      }
      iVar5 = (int)(6 / (long)iVar6);
      iVar6 = 7 - iVar6 * iVar5;
      RVar12 = iVar6 + (int)((lVar9 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar14] = RVar12;
    uVar4 = ref_node_add(ref_node,2,local + 2);
    if (uVar4 != 0) {
      uVar17 = (ulong)uVar4;
      pcVar15 = "add node";
      uVar10 = 0x2a2;
      goto LAB_0012fb6a;
    }
    pRVar2 = ref_node->real;
    lVar14 = (long)local[2];
    pRVar2[lVar14 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar14 * 0xf;
    *(undefined4 *)pRVar2 = 0;
    *(undefined4 *)((long)pRVar2 + 4) = 0;
    *(undefined4 *)(pRVar2 + 1) = 0;
    *(undefined4 *)((long)pRVar2 + 0xc) = 0x3ff00000;
    lVar9 = -1;
    if (((-1 < lVar14) && (local[2] < ref_node->max)) && (-1 < ref_node->global[lVar14])) {
      lVar9 = ref_node->global[lVar14];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 6) / iVar6;
    if (lVar9 / (long)iVar7 < (long)(ulong)((int)(6 % (long)iVar6) + 1)) {
      lVar9 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar9 = ref_node->global[lVar14];
        }
      }
      RVar12 = (REF_INT)(lVar9 / (long)iVar7);
    }
    else {
      lVar9 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar9 = ref_node->global[lVar14];
        }
      }
      iVar5 = (int)(6 / (long)iVar6);
      iVar6 = 7 - iVar6 * iVar5;
      RVar12 = iVar6 + (int)((lVar9 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar14] = RVar12;
    uVar4 = ref_node_add(ref_node,3,local + 3);
    if (uVar4 != 0) {
      uVar17 = (ulong)uVar4;
      pcVar15 = "add node";
      uVar10 = 0x2a3;
      goto LAB_0012fb6a;
    }
    pRVar3 = ref_node->real;
    lVar14 = (long)local[3];
    pRVar2 = pRVar3 + lVar14 * 0xf;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    pRVar3[lVar14 * 0xf + 2] = 1.0;
    lVar9 = -1;
    if (((-1 < lVar14) && (local[3] < ref_node->max)) && (-1 < ref_node->global[lVar14])) {
      lVar9 = ref_node->global[lVar14];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 6) / iVar6;
    if (lVar9 / (long)iVar7 < (long)(ulong)((int)(6 % (long)iVar6) + 1)) {
      lVar9 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar9 = ref_node->global[lVar14];
        }
      }
      RVar12 = (REF_INT)(lVar9 / (long)iVar7);
    }
    else {
      lVar9 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar9 = ref_node->global[lVar14];
        }
      }
      iVar5 = (int)(6 / (long)iVar6);
      iVar6 = 7 - iVar6 * iVar5;
      RVar12 = iVar6 + (int)((lVar9 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar14] = RVar12;
    uVar4 = ref_node_add(ref_node,4,local + 4);
    if (uVar4 != 0) {
      uVar17 = (ulong)uVar4;
      pcVar15 = "add node";
      uVar10 = 0x2a4;
      goto LAB_0012fb6a;
    }
    pRVar3 = ref_node->real;
    lVar14 = (long)local[4];
    pRVar2 = pRVar3 + lVar14 * 0xf;
    *pRVar2 = 1.0;
    pRVar2[1] = 0.0;
    pRVar3[lVar14 * 0xf + 2] = 1.0;
    lVar9 = -1;
    if (((-1 < lVar14) && (local[4] < ref_node->max)) && (-1 < ref_node->global[lVar14])) {
      lVar9 = ref_node->global[lVar14];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 6) / iVar6;
    if (lVar9 / (long)iVar7 < (long)(ulong)((int)(6 % (long)iVar6) + 1)) {
      lVar9 = -1;
      if ((-1 < local[4]) && (local[4] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar9 = ref_node->global[lVar14];
        }
      }
      RVar12 = (REF_INT)(lVar9 / (long)iVar7);
    }
    else {
      lVar9 = -1;
      if ((-1 < local[4]) && (local[4] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar9 = ref_node->global[lVar14];
        }
      }
      iVar5 = (int)(6 / (long)iVar6);
      iVar6 = 7 - iVar6 * iVar5;
      RVar12 = iVar6 + (int)((lVar9 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar14] = RVar12;
    uVar4 = ref_node_add(ref_node,5,local + 5);
    if (uVar4 != 0) {
      uVar17 = (ulong)uVar4;
      pcVar15 = "add node";
      uVar10 = 0x2a5;
      goto LAB_0012fb6a;
    }
    pRVar3 = ref_node->real;
    lVar14 = (long)local[5];
    pRVar2 = pRVar3 + lVar14 * 0xf;
    *(undefined4 *)pRVar2 = 0;
    *(undefined4 *)((long)pRVar2 + 4) = 0;
    *(undefined4 *)(pRVar2 + 1) = 0;
    *(undefined4 *)((long)pRVar2 + 0xc) = 0x3ff00000;
    pRVar3[lVar14 * 0xf + 2] = 1.0;
    lVar9 = -1;
    if (((-1 < lVar14) && (local[5] < ref_node->max)) && (-1 < ref_node->global[lVar14])) {
      lVar9 = ref_node->global[lVar14];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 6) / iVar6;
    if (lVar9 / (long)iVar7 < (long)(ulong)((int)(6 % (long)iVar6) + 1)) {
      lVar9 = -1;
      if ((-1 < local[5]) && (local[5] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar9 = ref_node->global[lVar14];
        }
      }
      RVar12 = (REF_INT)(lVar9 / (long)iVar7);
    }
    else {
      lVar9 = -1;
      if ((-1 < local[5]) && (local[5] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar9 = ref_node->global[lVar14];
        }
      }
      iVar5 = (int)(6 / (long)iVar6);
      iVar6 = 7 - iVar6 * iVar5;
      RVar12 = iVar6 + (int)((lVar9 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar14] = RVar12;
    uVar4 = ref_cell_add(pRVar1->cell[10],local,&cell);
    if (uVar4 != 0) {
      uVar17 = (ulong)uVar4;
      pcVar15 = "add prism";
      uVar10 = 0x2a7;
      goto LAB_0012fb6a;
    }
    iVar11 = ref_mpi->n;
    iVar7 = ref_mpi->id;
    iVar6 = (iVar11 + 6) / iVar11;
    iVar5 = (int)(6 / (long)iVar11);
    iVar13 = 7 - iVar5 * iVar11;
  }
  else {
    iVar6 = (iVar6 + 6) / iVar6;
    iVar11 = 0;
    if (iVar6 + 1U < 3) {
      iVar11 = iVar6;
    }
    iVar13 = 7 - iVar13;
    if (iVar13 <= iVar11) {
      iVar11 = (1 - iVar6 * iVar13) / iVar5 + iVar13;
    }
    if (iVar7 == iVar11) goto LAB_0012ea14;
    iVar11 = (int)(2 / (long)iVar6);
    if (iVar13 <= iVar11) {
      iVar11 = (2 - iVar6 * iVar13) / iVar5 + iVar13;
    }
    if (iVar7 == iVar11) goto LAB_0012ea14;
    iVar11 = (int)(3 / (long)iVar6);
    if (iVar13 <= iVar11) {
      iVar11 = (3 - iVar6 * iVar13) / iVar5 + iVar13;
    }
    if (iVar7 == iVar11) goto LAB_0012ea14;
    iVar11 = (int)(4 / (long)iVar6);
    if (iVar13 <= iVar11) {
      iVar11 = (4 - iVar6 * iVar13) / iVar5 + iVar13;
    }
    if (iVar7 == iVar11) goto LAB_0012ea14;
    iVar11 = (int)(5 / (long)iVar6);
    if (iVar13 <= iVar11) {
      iVar11 = (5 - iVar6 * iVar13) / iVar5 + iVar13;
    }
    if (iVar7 == iVar11) goto LAB_0012ea14;
  }
  iVar11 = (int)(3 / (long)iVar6);
  if (iVar13 <= iVar11) {
    iVar11 = (3 - iVar13 * iVar6) / iVar5 + iVar13;
  }
  if (iVar7 == iVar11) {
LAB_0012f17c:
    uVar4 = ref_node_add(ref_node,3,local);
    if (uVar4 != 0) {
      uVar17 = (ulong)uVar4;
      pcVar15 = "add node";
      uVar10 = 0x2b6;
      goto LAB_0012fb6a;
    }
    lVar9 = -1;
    pRVar3 = ref_node->real;
    lVar14 = (long)local[0];
    pRVar2 = pRVar3 + lVar14 * 0xf;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    pRVar3[lVar14 * 0xf + 2] = 1.0;
    if (((-1 < lVar14) && (local[0] < ref_node->max)) && (-1 < ref_node->global[lVar14])) {
      lVar9 = ref_node->global[lVar14];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 6) / iVar6;
    if (lVar9 / (long)iVar7 < (long)(ulong)((int)(6 % (long)iVar6) + 1)) {
      lVar9 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar9 = ref_node->global[lVar14];
        }
      }
      RVar12 = (REF_INT)(lVar9 / (long)iVar7);
    }
    else {
      lVar9 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar9 = ref_node->global[lVar14];
        }
      }
      iVar5 = (int)(6 / (long)iVar6);
      iVar6 = 7 - iVar6 * iVar5;
      RVar12 = iVar6 + (int)((lVar9 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar14] = RVar12;
    uVar4 = ref_node_add(ref_node,4,local + 1);
    if (uVar4 != 0) {
      uVar17 = (ulong)uVar4;
      pcVar15 = "add node";
      uVar10 = 0x2b7;
      goto LAB_0012fb6a;
    }
    pRVar3 = ref_node->real;
    lVar14 = (long)local[1];
    pRVar2 = pRVar3 + lVar14 * 0xf;
    *pRVar2 = 1.0;
    pRVar2[1] = 0.0;
    pRVar3[lVar14 * 0xf + 2] = 1.0;
    lVar9 = -1;
    if (((-1 < lVar14) && (local[1] < ref_node->max)) && (-1 < ref_node->global[lVar14])) {
      lVar9 = ref_node->global[lVar14];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 6) / iVar6;
    if (lVar9 / (long)iVar7 < (long)(ulong)((int)(6 % (long)iVar6) + 1)) {
      lVar9 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar9 = ref_node->global[lVar14];
        }
      }
      RVar12 = (REF_INT)(lVar9 / (long)iVar7);
    }
    else {
      lVar9 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar9 = ref_node->global[lVar14];
        }
      }
      iVar5 = (int)(6 / (long)iVar6);
      iVar6 = 7 - iVar6 * iVar5;
      RVar12 = iVar6 + (int)((lVar9 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar14] = RVar12;
    uVar4 = ref_node_add(ref_node,5,local + 2);
    if (uVar4 != 0) {
      uVar17 = (ulong)uVar4;
      pcVar15 = "add node";
      uVar10 = 0x2b8;
      goto LAB_0012fb6a;
    }
    pRVar3 = ref_node->real;
    lVar14 = (long)local[2];
    pRVar2 = pRVar3 + lVar14 * 0xf;
    *(undefined4 *)pRVar2 = 0;
    *(undefined4 *)((long)pRVar2 + 4) = 0;
    *(undefined4 *)(pRVar2 + 1) = 0;
    *(undefined4 *)((long)pRVar2 + 0xc) = 0x3ff00000;
    pRVar3[lVar14 * 0xf + 2] = 1.0;
    lVar9 = -1;
    if (((-1 < lVar14) && (local[2] < ref_node->max)) && (-1 < ref_node->global[lVar14])) {
      lVar9 = ref_node->global[lVar14];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 6) / iVar6;
    if (lVar9 / (long)iVar7 < (long)(ulong)((int)(6 % (long)iVar6) + 1)) {
      lVar9 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar9 = ref_node->global[lVar14];
        }
      }
      RVar12 = (REF_INT)(lVar9 / (long)iVar7);
    }
    else {
      lVar9 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar9 = ref_node->global[lVar14];
        }
      }
      iVar5 = (int)(6 / (long)iVar6);
      iVar6 = 7 - iVar6 * iVar5;
      RVar12 = iVar6 + (int)((lVar9 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar14] = RVar12;
    uVar4 = ref_node_add(ref_node,6,local + 3);
    if (uVar4 != 0) {
      uVar17 = (ulong)uVar4;
      pcVar15 = "add node";
      uVar10 = 0x2b9;
      goto LAB_0012fb6a;
    }
    pRVar3 = ref_node->real;
    lVar14 = (long)local[3];
    pRVar2 = pRVar3 + lVar14 * 0xf;
    *pRVar2 = 0.3;
    pRVar2[1] = 0.3;
    pRVar3[lVar14 * 0xf + 2] = 2.0;
    lVar9 = -1;
    if (((-1 < lVar14) && (local[3] < ref_node->max)) && (-1 < ref_node->global[lVar14])) {
      lVar9 = ref_node->global[lVar14];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 6) / iVar6;
    if (lVar9 / (long)iVar7 < (long)(ulong)((int)(6 % (long)iVar6) + 1)) {
      lVar9 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar9 = ref_node->global[lVar14];
        }
      }
      RVar12 = (REF_INT)(lVar9 / (long)iVar7);
    }
    else {
      lVar9 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar14]) {
          lVar9 = ref_node->global[lVar14];
        }
      }
      iVar5 = (int)(6 / (long)iVar6);
      iVar6 = 7 - iVar6 * iVar5;
      RVar12 = iVar6 + (int)((lVar9 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar14] = RVar12;
    uVar4 = ref_cell_add(pRVar1->cell[8],local,&cell);
    if (uVar4 != 0) {
      uVar17 = (ulong)uVar4;
      pcVar15 = "add prism";
      uVar10 = 699;
      goto LAB_0012fb6a;
    }
  }
  else {
    iVar11 = (int)(4 / (long)iVar6);
    if (iVar13 <= iVar11) {
      iVar11 = (4 - iVar13 * iVar6) / iVar5 + iVar13;
    }
    if (iVar7 == iVar11) goto LAB_0012f17c;
    iVar11 = (int)(5 / (long)iVar6);
    if (iVar13 <= iVar11) {
      iVar11 = (5 - iVar13 * iVar6) / iVar5 + iVar13;
    }
    if (iVar7 == iVar11) goto LAB_0012f17c;
    iVar11 = (int)(6 / (long)iVar6);
    if (iVar13 <= iVar11) {
      iVar11 = (6 - iVar6 * iVar13) / iVar5 + iVar13;
    }
    if (iVar7 == iVar11) goto LAB_0012f17c;
  }
  uVar4 = ref_node_initialize_n_global(ref_node,7);
  if (uVar4 != 0) {
    uVar17 = (ulong)uVar4;
    pcVar15 = "init glob";
    uVar10 = 0x2be;
    goto LAB_0012fb6a;
  }
  iVar6 = ref_mpi->n;
  iVar7 = ref_mpi->id;
  iVar11 = 0;
  iVar5 = (int)(6 / (long)iVar6);
  iVar13 = iVar5 * iVar6;
  if (6 < iVar13) {
    iVar11 = ((((iVar6 + 6) / iVar6) * (iVar13 + -7)) / iVar5 - iVar13) + 7;
  }
  if (iVar7 == iVar11) {
LAB_0012f713:
    uVar4 = ref_node_local(ref_node,0,local);
    if (uVar4 != 0) {
      uVar17 = (ulong)uVar4;
      pcVar15 = "loc";
      uVar10 = 0x2cd;
      goto LAB_0012fb6a;
    }
    uVar4 = ref_node_local(ref_node,3,local + 1);
    if (uVar4 != 0) {
      uVar17 = (ulong)uVar4;
      pcVar15 = "loc";
      uVar10 = 0x2ce;
      goto LAB_0012fb6a;
    }
    uVar4 = ref_node_local(ref_node,4,local + 2);
    if (uVar4 != 0) {
      uVar17 = (ulong)uVar4;
      pcVar15 = "loc";
      uVar10 = 0x2cf;
      goto LAB_0012fb6a;
    }
    uVar4 = ref_node_local(ref_node,1,local + 3);
    if (uVar4 != 0) {
      uVar17 = (ulong)uVar4;
      pcVar15 = "loc";
      uVar10 = 0x2d0;
      goto LAB_0012fb6a;
    }
    local[4] = 10;
    uVar4 = ref_cell_add(pRVar1->cell[6],local,&cell);
    if (uVar4 != 0) {
      uVar17 = (ulong)uVar4;
      pcVar15 = "add quad";
      uVar10 = 0x2d2;
      goto LAB_0012fb6a;
    }
    iVar6 = ref_mpi->n;
    iVar7 = ref_mpi->id;
    iVar11 = (iVar6 + 6) / iVar6;
    iVar5 = (int)(6 / (long)iVar6);
    iVar13 = iVar5 * iVar6;
    iVar16 = 7 - iVar13;
  }
  else {
    iVar11 = (iVar6 + 6) / iVar6;
    iVar8 = (int)(3 / (long)iVar11);
    iVar16 = 7 - iVar13;
    if (iVar16 <= iVar8) {
      iVar8 = (3 - iVar11 * iVar16) / iVar5 + iVar16;
    }
    if (iVar7 == iVar8) goto LAB_0012f713;
    iVar8 = (int)(4 / (long)iVar11);
    if (iVar16 <= iVar8) {
      iVar8 = (4 - iVar11 * iVar16) / iVar5 + iVar16;
    }
    if (iVar7 == iVar8) goto LAB_0012f713;
    iVar8 = 0;
    if (iVar11 + 1U < 3) {
      iVar8 = iVar11;
    }
    if (iVar16 <= iVar8) {
      iVar8 = (1 - iVar11 * iVar16) / iVar5 + iVar16;
    }
    if (iVar7 == iVar8) goto LAB_0012f713;
  }
  iVar8 = (int)(3 / (long)iVar11);
  if (iVar16 <= iVar8) {
    iVar8 = (3 - iVar16 * iVar11) / iVar5 + iVar16;
  }
  if (iVar7 == iVar8) {
LAB_0012f8e1:
    uVar4 = ref_node_local(ref_node,3,local);
    if (uVar4 != 0) {
      uVar17 = (ulong)uVar4;
      pcVar15 = "loc";
      uVar10 = 0x2df;
      goto LAB_0012fb6a;
    }
    uVar4 = ref_node_local(ref_node,5,local + 1);
    if (uVar4 != 0) {
      uVar17 = (ulong)uVar4;
      pcVar15 = "loc";
      uVar10 = 0x2e0;
      goto LAB_0012fb6a;
    }
    uVar4 = ref_node_local(ref_node,4,local + 2);
    if (uVar4 != 0) {
      uVar17 = (ulong)uVar4;
      pcVar15 = "loc";
      uVar10 = 0x2e1;
      goto LAB_0012fb6a;
    }
    local[3] = 100;
    uVar4 = ref_cell_add(pRVar1->cell[3],local,&cell);
    if (uVar4 != 0) {
      uVar17 = (ulong)uVar4;
      pcVar15 = "add tri";
      uVar10 = 0x2e3;
      goto LAB_0012fb6a;
    }
    iVar6 = ref_mpi->n;
    iVar7 = ref_mpi->id;
    iVar5 = (int)(6 / (long)iVar6);
    iVar13 = iVar5 * iVar6;
  }
  else {
    iVar8 = (int)(5 / (long)iVar11);
    if (iVar16 <= iVar8) {
      iVar8 = (5 - iVar16 * iVar11) / iVar5 + iVar16;
    }
    if (iVar7 == iVar8) goto LAB_0012f8e1;
    iVar8 = (int)(4 / (long)iVar11);
    if (iVar16 <= iVar8) {
      iVar8 = (4 - iVar11 * iVar16) / iVar5 + iVar16;
    }
    if (iVar7 == iVar8) goto LAB_0012f8e1;
  }
  iVar11 = 0;
  if (6 < iVar13) {
    iVar11 = ((((iVar6 + 6) / iVar6) * (iVar13 + -7)) / iVar5 - iVar13) + 7;
  }
  if (iVar7 != iVar11) {
    iVar6 = (iVar6 + 6) / iVar6;
    iVar11 = 0;
    if (iVar6 + 1U < 3) {
      iVar11 = iVar6;
    }
    iVar13 = 7 - iVar13;
    if (iVar13 <= iVar11) {
      iVar11 = (1 - iVar6 * iVar13) / iVar5 + iVar13;
    }
    if (iVar7 != iVar11) {
      iVar11 = (int)(2 / (long)iVar6);
      if (iVar13 <= iVar11) {
        iVar11 = (2 - iVar6 * iVar13) / iVar5 + iVar13;
      }
      if (iVar7 != iVar11) {
        return 0;
      }
    }
  }
  uVar4 = ref_node_local(ref_node,0,local);
  if (uVar4 == 0) {
    uVar4 = ref_node_local(ref_node,1,local + 1);
    if (uVar4 == 0) {
      uVar4 = ref_node_local(ref_node,2,local + 2);
      if (uVar4 == 0) {
        local[3] = 0x65;
        uVar4 = ref_cell_add(pRVar1->cell[3],local,&cell);
        if (uVar4 == 0) {
          return 0;
        }
        uVar17 = (ulong)uVar4;
        pcVar15 = "add tri";
        uVar10 = 0x2f4;
      }
      else {
        uVar17 = (ulong)uVar4;
        pcVar15 = "loc";
        uVar10 = 0x2f2;
      }
    }
    else {
      uVar17 = (ulong)uVar4;
      pcVar15 = "loc";
      uVar10 = 0x2f1;
    }
  }
  else {
    uVar17 = (ulong)uVar4;
    pcVar15 = "loc";
    uVar10 = 0x2f0;
  }
LAB_0012fb6a:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar10,
         "ref_fixture_pri_tet_cap_grid",uVar17,pcVar15);
  return (REF_STATUS)uVar17;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_pri_tet_cap_grid(REF_GRID *ref_grid_ptr,
                                                REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_INT nnodesg = 7;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 3;
  global[4] = 4;
  global[5] = 5;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[4]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[5])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 1.0, 0.0, 0.0);
    add_that_node(2, 0.0, 1.0, 0.0);
    add_that_node(3, 0.0, 0.0, 1.0);
    add_that_node(4, 1.0, 0.0, 1.0);
    add_that_node(5, 0.0, 1.0, 1.0);

    RSS(ref_cell_add(ref_grid_pri(ref_grid), local, &cell), "add prism");
  }

  global[0] = 3;
  global[1] = 4;
  global[2] = 5;
  global[3] = 6;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 0.0, 0.0, 1.0);
    add_that_node(1, 1.0, 0.0, 1.0);
    add_that_node(2, 0.0, 1.0, 1.0);
    add_that_node(3, 0.3, 0.3, 2.0);

    RSS(ref_cell_add(ref_grid_tet(ref_grid), local, &cell), "add prism");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  global[0] = 0;
  global[1] = 3;
  global[2] = 4;
  global[3] = 1;
  global[4] = 10;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    RSS(ref_node_local(ref_node, global[2], &(local[2])), "loc");
    RSS(ref_node_local(ref_node, global[3], &(local[3])), "loc");
    local[4] = global[4];
    RSS(ref_cell_add(ref_grid_qua(ref_grid), local, &cell), "add quad");
  }

  global[0] = 3;
  global[1] = 5;
  global[2] = 4;
  global[3] = 100;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    RSS(ref_node_local(ref_node, global[2], &(local[2])), "loc");
    local[3] = global[3];
    RSS(ref_cell_add(ref_grid_tri(ref_grid), local, &cell), "add tri");
  }

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 101;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    RSS(ref_node_local(ref_node, global[2], &(local[2])), "loc");
    local[3] = global[3];
    RSS(ref_cell_add(ref_grid_tri(ref_grid), local, &cell), "add tri");
  }

  return REF_SUCCESS;
}